

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O3

void __thiscall BamTools::FilterTool::~FilterTool(FilterTool *this)

{
  FilterSettings *this_00;
  FilterToolPrivate *this_01;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__FilterTool_001f0ee8;
  this_00 = this->m_settings;
  if (this_00 != (FilterSettings *)0x0) {
    FilterSettings::~FilterSettings(this_00);
  }
  operator_delete(this_00);
  this->m_settings = (FilterSettings *)0x0;
  this_01 = this->m_impl;
  if (this_01 != (FilterToolPrivate *)0x0) {
    FilterEngine<BamTools::BamAlignmentChecker>::~FilterEngine(&this_01->m_filterEngine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&this_01->m_propertyNames);
  }
  operator_delete(this_01);
  this->m_impl = (FilterToolPrivate *)0x0;
  return;
}

Assistant:

FilterTool::~FilterTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}